

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int main(int argc,char **argv)

{
  testDesc *ptVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  testDesc *ptVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  
  iVar6 = 0;
  _xmlFree = 0;
  _xmlMalloc = 0;
  _xmlRealloc = 0;
  _xmlMemStrdup = 0;
  xmlInitParser();
  xmlMemSetup(xmlMemFree,xmlMemMalloc,xmlMemRealloc,xmlMemoryStrdup);
  iVar7 = 1;
  setenv("XML_CATALOG_FILES","",1);
  xmlInitializeCatalog();
  xmlSchemaInitTypes();
  xmlRelaxNGInitTypes();
  if (1 < argc) {
    do {
      pcVar3 = argv[iVar7];
      if (*pcVar3 == '-') {
        if ((pcVar3[1] == 'v') && (pcVar3[2] == '\0')) {
          verbose = 1;
        }
        else {
          if ((pcVar3[1] != 'u') || (pcVar3[2] != '\0')) goto LAB_001086fd;
          update_results = 1;
        }
      }
      else {
LAB_001086fd:
        iVar2 = strcmp(pcVar3,"-quiet");
        if (iVar2 == 0) {
          tests_quiet = 1;
        }
        else {
          iVar2 = strcmp(pcVar3,"--out");
          if (iVar2 == 0) {
            temp_directory = argv[(long)iVar7 + 1];
            iVar7 = iVar7 + 1;
          }
          else {
            iVar2 = 0;
            ptVar5 = testDescriptions;
            do {
              pcVar3 = strstr(ptVar5->desc,argv[iVar7]);
              if (pcVar3 != (char *)0x0) {
                runtest(iVar2);
                iVar6 = iVar6 + 1;
              }
              iVar2 = iVar2 + 1;
              ptVar1 = ptVar5 + 1;
              ptVar5 = ptVar5 + 1;
            } while (ptVar1->func != (functest)0x0);
          }
        }
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < argc);
    if (iVar6 != 0) goto LAB_001087ac;
  }
  lVar4 = 0;
  do {
    runtest((int)lVar4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x36);
LAB_001087ac:
  bVar8 = nb_errors != 0 || nb_leaks != 0;
  if (bVar8) {
    printf("Total %d tests, %d errors, %d leaks\n",(ulong)(uint)nb_tests);
  }
  else {
    printf("Total %d tests, no errors\n",(ulong)(uint)nb_tests);
  }
  xmlCleanupParser();
  return (uint)bVar8;
}

Assistant:

int
main(int argc ATTRIBUTE_UNUSED, char **argv ATTRIBUTE_UNUSED) {
    int i, a, ret = 0;
    int subset = 0;

#if defined(_WIN32)
    setvbuf(stdout, NULL, _IONBF, 0);
    setvbuf(stderr, NULL, _IONBF, 0);
#endif

#if defined(_MSC_VER) && _MSC_VER >= 1400 && _MSC_VER < 1900
    _set_output_format(_TWO_DIGIT_EXPONENT);
#endif

    initializeLibxml2();

    for (a = 1; a < argc;a++) {
        if (!strcmp(argv[a], "-v"))
	    verbose = 1;
        else if (!strcmp(argv[a], "-u"))
	    update_results = 1;
        else if (!strcmp(argv[a], "-quiet"))
	    tests_quiet = 1;
        else if (!strcmp(argv[a], "--out"))
	    temp_directory = argv[++a];
	else {
	    for (i = 0; testDescriptions[i].func != NULL; i++) {
	        if (strstr(testDescriptions[i].desc, argv[a])) {
		    ret += runtest(i);
		    subset++;
		}
	    }
	}
    }
    if (subset == 0) {
	for (i = 0; testDescriptions[i].func != NULL; i++) {
	    ret += runtest(i);
	}
    }
    if ((nb_errors == 0) && (nb_leaks == 0)) {
        ret = 0;
	printf("Total %d tests, no errors\n",
	       nb_tests);
    } else {
        ret = 1;
	printf("Total %d tests, %d errors, %d leaks\n",
	       nb_tests, nb_errors, nb_leaks);
    }
    xmlCleanupParser();

    return(ret);
}